

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  vector<astar::Point,_std::allocator<astar::Point>_> path;
  Map maze;
  AStar aStar;
  Point end;
  Point start;
  AStar as;
  allocator_type local_465;
  allocator_type local_464;
  allocator_type local_463;
  allocator_type local_462;
  allocator_type local_461;
  allocator_type local_460;
  allocator_type local_45f;
  allocator_type local_45e;
  allocator_type local_45d;
  allocator_type local_45c;
  allocator_type local_45b;
  allocator_type local_45a;
  allocator_type local_459;
  vector<astar::Point,_std::allocator<astar::Point>_> local_458;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  Map local_420;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_400;
  undefined1 local_3e8 [24];
  undefined1 auStack_3d0 [24];
  vector<int,_std::allocator<int>_> vStack_3b8;
  undefined1 local_3a0 [32];
  float local_380;
  size_t local_378;
  vector<int,_std::allocator<int>_> vStack_370;
  vector<int,_std::allocator<int>_> local_358;
  vector<int,_std::allocator<int>_> local_340;
  vector<int,_std::allocator<int>_> local_328;
  vector<int,_std::allocator<int>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  vector<int,_std::allocator<int>_> local_2e0;
  timespec local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  Point local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  Point local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_238;
  undefined8 uStack_220;
  undefined4 local_218;
  vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_> local_210;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1f0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_1f0._M_buckets = &local_1f0._M_single_bucket;
  local_238.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_220 = 0;
  local_238.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218 = 8;
  local_210.super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210.super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0._M_bucket_count = 1;
  local_1f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1f0._M_element_count = 0;
  local_1f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1f0._M_rehash_policy._M_next_resize = 0;
  local_1f0._M_single_bucket = (__node_base_ptr)0x0;
  local_438 = 0;
  uStack_430 = 0;
  local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_440 = 0;
  local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&local_458;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3e8,__l,&local_459);
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8.tv_sec = 0;
  local_2c8.tv_nsec = 0;
  __l_00._M_len = 0xc;
  __l_00._M_array = (iterator)&local_2c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_3d0,__l_00,&local_45a);
  local_248 = 0x100000001;
  uStack_240 = 1;
  local_258 = 0x100000001;
  uStack_250 = 0;
  local_268.x = 0;
  local_268.y = 0;
  uStack_260 = 0x100000001;
  __l_01._M_len = 0xc;
  __l_01._M_array = &local_268.x;
  std::vector<int,_std::allocator<int>_>::vector(&vStack_3b8,__l_01,&local_45b);
  local_278 = 0;
  uStack_270 = 1;
  local_288 = 0;
  uStack_280 = 0;
  local_298.x = 0;
  local_298.y = 0;
  uStack_290 = 1;
  __l_02._M_len = 0xc;
  __l_02._M_array = &local_298.x;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3a0,__l_02,&local_45c);
  local_48 = 0;
  uStack_40 = 1;
  local_58 = 0;
  uStack_50 = 1;
  local_68 = 0;
  uStack_60 = 1;
  __l_03._M_len = 0xc;
  __l_03._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_3a0 + 0x18),__l_03,&local_45d);
  local_78 = 0;
  uStack_70 = 1;
  local_88 = 0;
  uStack_80 = 1;
  local_98 = 0;
  uStack_90 = 0;
  __l_04._M_len = 0xc;
  __l_04._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&vStack_370,__l_04,&local_45e);
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 1;
  local_c8 = 0;
  uStack_c0 = 1;
  __l_05._M_len = 0xc;
  __l_05._M_array = (iterator)&local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_358,__l_05,&local_45f);
  local_d8 = 0;
  uStack_d0 = 1;
  local_e8 = 0;
  uStack_e0 = 1;
  local_f8 = 0;
  uStack_f0 = 1;
  __l_06._M_len = 0xc;
  __l_06._M_array = (iterator)&local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_340,__l_06,&local_460);
  local_108 = 0;
  uStack_100 = 1;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 1;
  __l_07._M_len = 0xc;
  __l_07._M_array = (iterator)&local_128;
  std::vector<int,_std::allocator<int>_>::vector(&local_328,__l_07,&local_461);
  local_138 = 0x100000001;
  uStack_130 = 1;
  local_148 = 1;
  uStack_140 = 0x100000000;
  local_158 = 0;
  uStack_150 = 0x100000001;
  __l_08._M_len = 0xc;
  __l_08._M_array = (iterator)&local_158;
  std::vector<int,_std::allocator<int>_>::vector(&local_310,__l_08,&local_462);
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  __l_09._M_len = 0xc;
  __l_09._M_array = (iterator)&local_188;
  std::vector<int,_std::allocator<int>_>::vector(&local_2f8,__l_09,&local_463);
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  __l_10._M_len = 0xc;
  __l_10._M_array = (iterator)&local_1b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_2e0,__l_10,&local_464);
  __l_11._M_len = 0xc;
  __l_11._M_array = (iterator)local_3e8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_400,__l_11,&local_465);
  astar::Map::Map(&local_420,&local_400);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_400);
  lVar8 = 0x120;
  do {
    pvVar3 = *(void **)((long)&local_400.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar8);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)(local_3e8 + lVar8 + -8) - (long)pvVar3);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  local_3a0._0_8_ = &vStack_370;
  local_3e8._16_8_ = (pointer)0x0;
  auStack_3d0._0_8_ = (pointer)0x0;
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8._8_8_ = (pointer)0x0;
  auStack_3d0._8_4_ = D8;
  auStack_3d0._16_8_ = (pointer)0x0;
  vStack_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vStack_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3a0._8_8_ = (pointer)0x1;
  local_3a0._16_8_ = (_Hash_node_base *)0x0;
  local_3a0._24_8_ = 0;
  local_380 = 1.0;
  local_378 = 0;
  vStack_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  astar::AStar::LoadMap((AStar *)local_3e8,&local_420);
  local_268.x = 0;
  local_268.y = 0;
  local_298.x = 0xb;
  local_298.y = 0xb;
  DefPoint(&local_420,&local_268,&local_298);
  astar::AStar::FindPath(&local_458,(AStar *)local_3e8,&local_268,&local_298);
  PrintMaze(&local_420);
  if (local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"path not found",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  else {
    if (local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        local_2c8.tv_sec = 1;
        local_2c8.tv_nsec = 0;
        do {
          iVar5 = nanosleep(&local_2c8,&local_2c8);
          if (iVar5 != -1) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
        if (local_420.n != -1) {
          iVar5 = local_420.n + 1;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,backLine_abi_cxx11_._M_dataplus._M_p,
                       backLine_abi_cxx11_._M_string_length);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        uVar1 = local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9].x;
        if ((int)uVar1 < local_420.m) {
          uVar2 = local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9].y;
          if ((-1 < (int)(uVar1 | uVar2)) && ((int)uVar2 < local_420.n)) {
            local_420.map.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar1].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar2] = 4;
          }
        }
        PrintMaze(&local_420);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,backLine_abi_cxx11_._M_dataplus._M_p,
                   backLine_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_458.
                            super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar9].x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,local_458.
                                   super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar9].y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (uVar9 < (ulong)((long)local_458.
                                     super__Vector_base<astar::Point,_std::allocator<astar::Point>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_458.
                                     super__Vector_base<astar::Point,_std::allocator<astar::Point>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    for (iVar5 = local_420.n + 2; iVar5 != 0; iVar5 = iVar5 + -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,backLine_abi_cxx11_._M_dataplus._M_p,
                 backLine_abi_cxx11_._M_string_length);
    }
    PrintMaze(&local_420);
    if ((long)local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      uVar10 = 0;
    }
    else {
      uVar9 = 0;
      uVar4 = 1;
      do {
        uVar10 = uVar4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_458.
                            super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar9].x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,local_458.
                                   super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar9].y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") -> ",5);
        uVar9 = uVar10;
        uVar4 = (ulong)((int)uVar10 + 1);
      } while (uVar10 < ((long)local_458.
                               super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_458.
                               super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    poVar7 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar10].x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,local_458.
                               super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar10].y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if (local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_3a0);
  std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::~vector
            ((vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_> *)
             (auStack_3d0 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_3e8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_420.map);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1f0);
  std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::~vector
            (&local_210);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_238);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    astar::AStar as(astar::D8);

    astar::Map maze({{0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 1, 1, 1, 1, 0, 0, 1, 1, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 0, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 1, 1, 0, 0, 1, 1, 1, 1, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}});

    astar::AStar aStar(astar::D8);
    aStar.LoadMap(maze);

    astar::Point start = {0, 0};
    astar::Point end = {11, 11};
    DefPoint(maze, start, end);
    auto path = aStar.FindPath(start, end);

    // display the maze
    uint32_t count = 0;
    PrintMaze(maze);
    if (path.empty()) {
        std::cout << "path not found" << std::endl;
        return 0;
    }
    while (count < path.size()) {
        std::this_thread::sleep_for(1s);
        ClearScreen(maze.Height() + 1);
        maze.Assign(path[count], 4);
        PrintMaze(maze);
        ClearScreen(1);
        std::cout << "(" << path[count].x << ", " << path[count].y << ")" << std::endl;
        count++;
    }
    ClearScreen(maze.Height() + 2);
    PrintMaze(maze);
    uint32_t i = 0;
    for (; i < (path.size() - 1); i++) {
        std::cout << "(" << path[i].x << ", " << path[i].y << ") -> ";
    }
    std::cout << "(" << path[i].x << ", " << path[i].y << ")" << std::endl;
    return 0;
}